

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int ac,char **av)

{
  double dVar1;
  bool bVar2;
  char *pcVar3;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  typed_value<int,_char> *ptVar5;
  typed_value<double,_char> *ptVar6;
  size_type sVar7;
  ostream *poVar8;
  dataset_t *this;
  mscomplex_t *this_00;
  type this_01;
  type pmVar9;
  int iVar10;
  int comp_no;
  timer t;
  allocator local_363;
  allocator local_362;
  allocator local_361;
  mscomplex_ptr_t msc;
  dataset_ptr_t ds;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  double simp_tresh;
  tri_idx_list_t tlist;
  fn_list_t fns;
  dataset_ptr_t local_2e0;
  dataset_ptr_t local_2d0;
  mscomplex_ptr_t local_2c0;
  string bin_filename;
  string off_filename;
  string tri_filename;
  string simp_method;
  required_option e;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_178;
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_140 [144];
  options_description desc;
  
  tri_filename._M_dataplus._M_p = (pointer)&tri_filename.field_2;
  tri_filename._M_string_length = 0;
  bin_filename._M_dataplus._M_p = (pointer)&bin_filename.field_2;
  bin_filename._M_string_length = 0;
  tri_filename.field_2._M_local_buf[0] = '\0';
  bin_filename.field_2._M_local_buf[0] = '\0';
  off_filename._M_dataplus._M_p = (pointer)&off_filename.field_2;
  off_filename._M_string_length = 0;
  simp_method._M_dataplus._M_p = (pointer)&simp_method.field_2;
  simp_method._M_string_length = 0;
  off_filename.field_2._M_local_buf[0] = '\0';
  comp_no = 0;
  simp_method.field_2._M_local_buf[0] = '\0';
  simp_tresh = 0.0;
  std::__cxx11::string::string((string *)&e,"Allowed options",(allocator *)&vm);
  boost::program_options::options_description::options_description
            (&desc,(string *)&e,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&e);
  fns.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)boost::program_options::options_description::add_options();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&fns,"help,h");
  ptVar4 = boost::program_options::value<std::__cxx11::string>(&tri_filename);
  std::__cxx11::string::string((string *)&e,"",(allocator *)&t);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&e);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"tri-file,t",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>(&bin_filename);
  std::__cxx11::string::string((string *)&vm,"",&local_361);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&vm);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"bin-file,b",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>(&off_filename);
  std::__cxx11::string::string((string *)&local_340,"",&local_362);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&local_340);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"off-file,o",(char *)ptVar4);
  ptVar5 = boost::program_options::value<int>(&comp_no);
  msc.px._0_4_ = 0;
  ptVar5 = boost::program_options::typed_value<int,_char>::default_value(ptVar5,(int *)&msc);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"comp-no,c",(char *)ptVar5);
  ptVar6 = boost::program_options::value<double>(&simp_tresh);
  ds.px = (element_type *)0x0;
  ptVar6 = boost::program_options::typed_value<double,_char>::default_value(ptVar6,(double *)&ds);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"simp-tresh,s",(char *)ptVar6);
  ptVar4 = boost::program_options::value<std::__cxx11::string>(&simp_method);
  std::__cxx11::string::string((string *)&tlist,"P",&local_363);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&tlist);
  boost::program_options::options_description_easy_init::operator()
            (pcVar3,(value_semantic *)"simp-method",(char *)ptVar4);
  std::__cxx11::string::~string((string *)&tlist);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&vm);
  std::__cxx11::string::~string((string *)&e);
  boost::program_options::variables_map::variables_map(&vm);
  local_178.super_function_base.vtable = (vtable_base *)0x0;
  local_178.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_178.super_function_base.functor._8_8_ = 0;
  local_178.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)&e,ac,av,&desc,0,&local_178);
  boost::program_options::store((basic_parsed_options *)&e,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&e);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_178);
  std::__cxx11::string::string((string *)&e,"help",(allocator *)&local_340);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_140,(key_type *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (sVar7 == 0) {
    boost::program_options::notify(&vm);
    if ((bin_filename._M_string_length == 0 || tri_filename._M_string_length == 0) &&
       (off_filename._M_string_length == 0)) {
      poVar8 = std::operator<<((ostream *)&std::cout,"Must specify either tri-bin or off file");
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&desc);
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar10 = 1;
    }
    else {
      utl::timer::timer(&t);
      t._start_time = boost::date_time::microsec_clock<boost::posix_time::ptime>::local_time();
      poVar8 = std::operator<<((ostream *)&std::cout,"====================================");
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<((ostream *)&std::cout,"         Starting Processing        ");
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<((ostream *)&std::cout,"------------------------------------");
      std::endl<char,std::char_traits<char>>(poVar8);
      tlist.
      super__Vector_base<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tlist.
      super__Vector_base<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      tlist.
      super__Vector_base<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fns.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      fns.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      fns.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      poVar8 = std::operator<<((ostream *)&std::cout,"selected comp = ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,comp_no);
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<((ostream *)&std::cout,"------------------------------------");
      std::endl<char,std::char_traits<char>>(poVar8);
      e._0_8_ = &e.field_0x10;
      e._8_8_ = 0;
      e._16_1_ = 0;
      if (off_filename._M_string_length == 0) {
        print_bin_info(&bin_filename);
        read_tri_tlist(tri_filename._M_dataplus._M_p,&tlist);
        read_bin_file<double>(&fns,&bin_filename,comp_no);
      }
      else {
        read_off_file<double>(&off_filename,&fns,&tlist,comp_no);
      }
      std::__cxx11::string::_M_assign((string *)&e);
      std::operator<<((ostream *)&std::cout,"data read ---------------- ");
      dVar1 = utl::timer::elapsed(&t);
      poVar8 = std::ostream::_M_insert<double>(dVar1);
      std::endl<char,std::char_traits<char>>(poVar8);
      this = (dataset_t *)operator_new(0x60);
      trimesh::dataset_t::dataset_t(this,&fns,&tlist);
      boost::shared_ptr<trimesh::dataset_t>::shared_ptr<trimesh::dataset_t>(&ds,this);
      this_00 = (mscomplex_t *)operator_new(400);
      trimesh::mscomplex_t::mscomplex_t(this_00);
      boost::shared_ptr<trimesh::mscomplex_t>::shared_ptr<trimesh::mscomplex_t>(&msc,this_00);
      this_01 = boost::shared_ptr<trimesh::dataset_t>::operator->(&ds);
      local_2c0.px = (element_type *)CONCAT44(msc.px._4_4_,msc.px._0_4_);
      local_2c0.pn.pi_ = msc.pn.pi_;
      if (msc.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (msc.pn.pi_)->use_count_ = (msc.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      trimesh::dataset_t::work(this_01,&local_2c0);
      boost::detail::shared_count::~shared_count(&local_2c0.pn);
      std::operator<<((ostream *)&std::cout,"gradient done ------------ ");
      dVar1 = utl::timer::elapsed(&t);
      poVar8 = std::ostream::_M_insert<double>(dVar1);
      std::endl<char,std::char_traits<char>>(poVar8);
      pmVar9 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(&msc);
      trimesh::mscomplex_t::simplify(pmVar9,0.0,false,0,0);
      pmVar9 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(&msc);
      local_2d0.px = ds.px;
      local_2d0.pn.pi_ = ds.pn.pi_;
      if (ds.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (ds.pn.pi_)->use_count_ = (ds.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      trimesh::mscomplex_t::collect_mfolds(pmVar9,&local_2d0);
      boost::detail::shared_count::~shared_count(&local_2d0.pn);
      pmVar9 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(&msc);
      std::operator+(&local_340,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                     ".mscomplex.full.bin");
      trimesh::mscomplex_t::save(pmVar9,&local_340);
      std::__cxx11::string::~string((string *)&local_340);
      std::operator<<((ostream *)&std::cout,"write unsimplified done -- ");
      dVar1 = utl::timer::elapsed(&t);
      poVar8 = std::ostream::_M_insert<double>(dVar1);
      std::endl<char,std::char_traits<char>>(poVar8);
      bVar2 = std::operator==(&simp_method,"P");
      if (bVar2) {
        pmVar9 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(&msc);
        trimesh::mscomplex_t::simplify(pmVar9,simp_tresh,false,0,0);
      }
      std::operator<<((ostream *)&std::cout,"simplification done ------ ");
      dVar1 = utl::timer::elapsed(&t);
      poVar8 = std::ostream::_M_insert<double>(dVar1);
      std::endl<char,std::char_traits<char>>(poVar8);
      pmVar9 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(&msc);
      local_2e0.px = ds.px;
      local_2e0.pn.pi_ = ds.pn.pi_;
      if (ds.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (ds.pn.pi_)->use_count_ = (ds.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      trimesh::mscomplex_t::collect_mfolds(pmVar9,&local_2e0);
      boost::detail::shared_count::~shared_count(&local_2e0.pn);
      pmVar9 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(&msc);
      std::operator+(&local_340,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                     ".mscomplex.bin");
      trimesh::mscomplex_t::save(pmVar9,&local_340);
      std::__cxx11::string::~string((string *)&local_340);
      std::operator<<((ostream *)&std::cout,"write simplified done ---- ");
      dVar1 = utl::timer::elapsed(&t);
      poVar8 = std::ostream::_M_insert<double>(dVar1);
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<((ostream *)&std::cout,"------------------------------------");
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<((ostream *)&std::cout,"        Finished Processing         ");
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<((ostream *)&std::cout,"====================================");
      std::endl<char,std::char_traits<char>>(poVar8);
      boost::detail::shared_count::~shared_count(&msc.pn);
      boost::detail::shared_count::~shared_count(&ds.pn);
      std::__cxx11::string::~string((string *)&e);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&fns.super__Vector_base<double,_std::allocator<double>_>);
      std::
      _Vector_base<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
      ::~_Vector_base(&tlist.
                       super__Vector_base<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                     );
      iVar10 = 0;
    }
  }
  else {
    poVar8 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&desc);
    iVar10 = 0;
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  boost::program_options::variables_map::~variables_map(&vm);
  boost::program_options::options_description::~options_description(&desc);
  std::__cxx11::string::~string((string *)&simp_method);
  std::__cxx11::string::~string((string *)&off_filename);
  std::__cxx11::string::~string((string *)&bin_filename);
  std::__cxx11::string::~string((string *)&tri_filename);
  return iVar10;
}

Assistant:

int main(int ac , char **av)
{
  string tri_filename;
  string bin_filename;
  string off_filename;
  string simp_method;

  int    comp_no = 0;
  double simp_tresh  = 0.0;

  bpo::options_description desc("Allowed options");
  desc.add_options()
      ("help,h", "produce help message")
      ("tri-file,t",bpo::value(&tri_filename)->default_value(""),
       "tri file name")
      ("bin-file,b",bpo::value(&bin_filename)->default_value(""),
       "bin file name (function file)")
      ("off-file,o",bpo::value(&off_filename)->default_value(""),
       "off file name")
      ("comp-no,c",bpo::value(&comp_no)->default_value(0),
       "scalar component number to use for the MS compelex")
      ("simp-tresh,s",bpo::value(&simp_tresh)->default_value(0.0),
       "simplification treshold\n"\
       "\n"\
       "====For simp-method = \"P\"=========\n"\
       "if s in [0,1] then simplify all features having pers < s\n"\
       "if s < 0 then simplify till there are int(-s) minima\n"\
       "if s > 1 then simplify till there are int(s)  maxima\n"\
       "\n")
      ("simp-method",bpo::value(&simp_method)->default_value("P"),
       "simplification method to use\n"\
       "P  ----> Persistence\n"\
//       "AWP ---> Area weighted persistence\n"\
//       "ABP ---> Area before persistence"
       );

  bpo::variables_map vm;
  bpo::store(bpo::parse_command_line(ac, av, desc), vm);

  if (vm.count("help"))
  {
    cout << desc << endl;
    return 0;
  }
  try
  {
    bpo::notify(vm);
  }
  catch(bpo::required_option e)
  {
    cout<<e.what()<<endl;
    cout<<desc<<endl;
    return 1;
  }

  if((tri_filename.empty() || bin_filename.empty()) && off_filename.empty())
  {
    cout<<"Must specify either tri-bin or off file"<<endl;
    cout<<desc<<endl;
    return 1;
  }

  utl::timer t;
  t.restart();

  cout<<"===================================="<<endl;
  cout<<"         Starting Processing        "<<endl;
  cout<<"------------------------------------"<<endl;

  trimesh::tri_idx_list_t tlist;
  trimesh::fn_list_t      fns;
  cout<<"selected comp = "<<comp_no<<endl;
  cout<<"------------------------------------"<<endl;

  string fn_pfx;

  if(off_filename.empty())
  {
    print_bin_info(bin_filename);
    read_tri_tlist(tri_filename.c_str(),tlist);
    read_bin_file(fns,bin_filename,comp_no);
    fn_pfx = tri_filename;
  }
  else
  {
    read_off_file(off_filename,fns,tlist,comp_no);
    fn_pfx = off_filename;
  }
  cout<<"data read ---------------- "<<t.elapsed()<<endl;

  trimesh::dataset_ptr_t   ds(new trimesh::dataset_t(fns,tlist));
  trimesh::mscomplex_ptr_t msc(new trimesh::mscomplex_t);
  ds->work(msc);
  cout<<"gradient done ------------ "<<t.elapsed()<<endl;

  msc->simplify(0.0);
  msc->collect_mfolds(ds);

  msc->save(fn_pfx+".mscomplex.full.bin");
  cout<<"write unsimplified done -- "<<t.elapsed()<<endl;


  if( simp_method == "P")
  {
    msc->simplify(simp_tresh);
  }
//  else if (simp_method == "AWP" || simp_method == "ABP")
//  {
//    tri_cc_geom_t::vertex_list_t vlist;

//    if(off_filename.empty())
//      read_tri_vlist(tri_filename.c_str(),vlist);
//    else
//      read_off_vlist(off_filename.c_str(),vlist);

//    tri_cc_geom_ptr_t tcc(new tri_cc_geom_t);
//    tcc->init(ds->m_tcc,vlist);

//    if(simp_method == "AWP")
//      trimesh::simplify_awp(msc,tcc,simp_tresh);
//    else if(simp_method == "ABP")
//      trimesh::simplify_abp(msc,tcc,simp_tresh);

//  }

  cout<<"simplification done ------ "<<t.elapsed()<<endl;

  msc->collect_mfolds(ds);
  msc->save(fn_pfx+".mscomplex.bin");
  cout<<"write simplified done ---- "<<t.elapsed()<<endl;

  cout<<"------------------------------------"<<endl;
  cout<<"        Finished Processing         "<<endl;
  cout<<"===================================="<<endl;
}